

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsNumberToInt(JsValueRef value,int *asInt)

{
  bool bVar1;
  int32 iVar2;
  JsErrorCode JVar3;
  double T1;
  DebugCheckNoException local_20;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asInt == (int *)0x0) {
    return JsErrorNullArgument;
  }
  local_20.hasException = true;
  local_20.__exceptionCheck = ExceptionCheck::Save();
  bVar1 = Js::TaggedInt::Is(value);
  if (bVar1) {
    iVar2 = Js::TaggedInt::ToInt32(value);
  }
  else {
    if ((ulong)value >> 0x32 == 0) {
      JVar3 = JsErrorInvalidArgument;
      iVar2 = 0;
      goto LAB_00360f2c;
    }
    T1 = Js::JavascriptNumber::GetValue(value);
    iVar2 = Js::JavascriptConversion::ToInt32(T1);
  }
  JVar3 = JsNoError;
LAB_00360f2c:
  *asInt = iVar2;
  local_20.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_20);
  return JVar3;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsNumberToInt(_In_ JsValueRef value, _Out_ int *asInt)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asInt);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asInt = Js::TaggedInt::ToInt32(value);
        }